

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsequentialanimationgroup.cpp
# Opt level: O1

void __thiscall
QSequentialAnimationGroupPrivate::advanceForwards
          (QSequentialAnimationGroupPrivate *this,AnimationIndex *newAnimationIndex)

{
  long lVar1;
  QAbstractAnimation *pQVar2;
  parameter_type pVar3;
  int iVar4;
  long lVar5;
  
  iVar4 = this->lastLoop;
  pVar3 = QObjectCompatProperty<QAbstractAnimationPrivate,_int,_&QAbstractAnimationPrivate::_qt_property_currentLoop_offset,_nullptr,_&QAbstractAnimationPrivate::emitCurrentLoopChanged,_nullptr>
          ::value(&(this->super_QAnimationGroupPrivate).super_QAbstractAnimationPrivate.currentLoop)
  ;
  if (iVar4 < pVar3) {
    for (lVar5 = (long)this->currentAnimationIndex;
        lVar1 = (this->super_QAnimationGroupPrivate).animations.d.size, lVar5 < lVar1;
        lVar5 = lVar5 + 1) {
      pQVar2 = (QAbstractAnimation *)(this->super_QAnimationGroupPrivate).animations.d.ptr[lVar5];
      setCurrentAnimation(this,(int)lVar5,true);
      iVar4 = QAbstractAnimation::totalDuration
                        ((QAbstractAnimation *)
                         (this->super_QAnimationGroupPrivate).animations.d.ptr[lVar5]);
      if ((iVar4 == -1) && (iVar4 = -1, lVar5 < (this->actualDuration).d.size)) {
        iVar4 = (this->actualDuration).d.ptr[lVar5];
      }
      QAbstractAnimation::setCurrentTime(pQVar2,iVar4);
    }
    if (lVar1 == 1) {
      activateCurrentAnimation(this,false);
    }
    else {
      setCurrentAnimation(this,0,true);
    }
  }
  lVar5 = (long)this->currentAnimationIndex;
  if (this->currentAnimationIndex < newAnimationIndex->index) {
    do {
      pQVar2 = (QAbstractAnimation *)(this->super_QAnimationGroupPrivate).animations.d.ptr[lVar5];
      setCurrentAnimation(this,(int)lVar5,true);
      iVar4 = QAbstractAnimation::totalDuration
                        ((QAbstractAnimation *)
                         (this->super_QAnimationGroupPrivate).animations.d.ptr[lVar5]);
      if ((iVar4 == -1) && (iVar4 = -1, lVar5 < (this->actualDuration).d.size)) {
        iVar4 = (this->actualDuration).d.ptr[lVar5];
      }
      QAbstractAnimation::setCurrentTime(pQVar2,iVar4);
      lVar5 = lVar5 + 1;
    } while (lVar5 < newAnimationIndex->index);
  }
  return;
}

Assistant:

void QSequentialAnimationGroupPrivate::advanceForwards(const AnimationIndex &newAnimationIndex)
{
    if (lastLoop < currentLoop) {
        // we need to fast forward to the end
        for (int i = currentAnimationIndex; i < animations.size(); ++i) {
            QAbstractAnimation *anim = animations.at(i);
            setCurrentAnimation(i, true);
            anim->setCurrentTime(animationActualTotalDuration(i));
        }
        // this will make sure the current animation is reset to the beginning
        if (animations.size() == 1)
            // we need to force activation because setCurrentAnimation will have no effect
            activateCurrentAnimation();
        else
            setCurrentAnimation(0, true);
    }

    // and now we need to fast forward from the current position to
    for (int i = currentAnimationIndex; i < newAnimationIndex.index; ++i) {     //### WRONG,
        QAbstractAnimation *anim = animations.at(i);
        setCurrentAnimation(i, true);
        anim->setCurrentTime(animationActualTotalDuration(i));
    }
    // setting the new current animation will happen later
}